

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler.cpp
# Opt level: O2

void indk::Profiler::doAttachCallback(NeuralNet *object,int flag,ProfilerCallback *callback)

{
  pair<std::function<void_(indk::NeuralNet_*)>,_int> local_70;
  pair<indk::NeuralNet_*,_std::pair<std::function<void_(indk::NeuralNet_*)>,_int>_> local_48;
  
  std::function<void_(indk::NeuralNet_*)>::function(&local_70.first,callback);
  local_70.second = flag;
  local_48.first = object;
  std::pair<std::function<void_(indk::NeuralNet_*)>,_int>::pair(&local_48.second,&local_70);
  std::
  _Rb_tree<indk::NeuralNet*,std::pair<indk::NeuralNet*const,std::pair<std::function<void(indk::NeuralNet*)>,int>>,std::_Select1st<std::pair<indk::NeuralNet*const,std::pair<std::function<void(indk::NeuralNet*)>,int>>>,std::less<indk::NeuralNet*>,std::allocator<std::pair<indk::NeuralNet*const,std::pair<std::function<void(indk::NeuralNet*)>,int>>>>
  ::
  _M_emplace_equal<std::pair<indk::NeuralNet*,std::pair<std::function<void(indk::NeuralNet*)>,int>>>
            ((_Rb_tree<indk::NeuralNet*,std::pair<indk::NeuralNet*const,std::pair<std::function<void(indk::NeuralNet*)>,int>>,std::_Select1st<std::pair<indk::NeuralNet*const,std::pair<std::function<void(indk::NeuralNet*)>,int>>>,std::less<indk::NeuralNet*>,std::allocator<std::pair<indk::NeuralNet*const,std::pair<std::function<void(indk::NeuralNet*)>,int>>>>
              *)&Callbacks,&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48.second);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  return;
}

Assistant:

void indk::Profiler::doAttachCallback(indk::NeuralNet *object, int flag, indk::ProfilerCallback callback) {
    Callbacks.insert(std::make_pair(object, std::make_pair(callback, flag)));
}